

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3PendingTermsAdd(Fts3Table *p,int iLangid,char *zText,int iCol,u32 *pnWord)

{
  int nToken_00;
  sqlite3_tokenizer_module *psVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int nToken;
  int iPos;
  int iEnd;
  int iStart;
  sqlite3_tokenizer_cursor *local_60;
  char *zToken;
  sqlite3_tokenizer_module *local_50;
  u32 *local_48;
  _func_int_sqlite3_tokenizer_cursor_ptr_char_ptr_ptr_int_ptr_int_ptr_int_ptr_int_ptr *local_40;
  sqlite3_tokenizer_cursor *pCsr;
  
  iStart = 0;
  iEnd = 0;
  iPos = 0;
  nToken = 0;
  if (zText == (char *)0x0) {
    *pnWord = 0;
    iVar2 = 0;
  }
  else {
    psVar1 = p->pTokenizer->pModule;
    iVar2 = sqlite3Fts3OpenTokenizer(p->pTokenizer,iLangid,zText,-1,&pCsr);
    if (iVar2 == 0) {
      local_40 = psVar1->xNext;
      iVar2 = 0;
      local_60 = pCsr;
      iVar3 = 0;
      local_50 = psVar1;
      local_48 = pnWord;
      while( true ) {
        if ((iVar3 != 0) ||
           (iVar3 = (*local_40)(local_60,&zToken,&nToken,&iStart,&iEnd,&iPos), iVar3 != 0))
        goto LAB_001aa5af;
        if (iVar2 <= iPos) {
          iVar2 = iPos + 1;
        }
        if (((iPos < 0) || (zToken == (char *)0x0)) || (nToken < 1)) break;
        iVar3 = fts3PendingTermsAddOne(p,iCol,iPos,&p->aIndex->hPending,zToken,nToken);
        lVar5 = 0x30;
        for (lVar4 = 1; (iVar3 == 0 && (lVar4 < p->nIndex)); lVar4 = lVar4 + 1) {
          nToken_00 = *(int *)((long)p->aIndex + lVar5 + -8);
          iVar3 = 0;
          if (nToken_00 <= nToken) {
            iVar3 = fts3PendingTermsAddOne
                              (p,iCol,iPos,(Fts3Hash *)((long)&p->aIndex->nPrefix + lVar5),zToken,
                               nToken_00);
          }
          lVar5 = lVar5 + 0x28;
        }
      }
      iVar3 = 1;
LAB_001aa5af:
      (*local_50->xClose)(local_60);
      *local_48 = *local_48 + iVar2;
      iVar2 = 0;
      if (iVar3 != 0x65) {
        iVar2 = iVar3;
      }
    }
  }
  return iVar2;
}

Assistant:

static int fts3PendingTermsAdd(
  Fts3Table *p,                   /* Table into which text will be inserted */
  int iLangid,                    /* Language id to use */
  const char *zText,              /* Text of document to be inserted */
  int iCol,                       /* Column into which text is being inserted */
  u32 *pnWord                     /* IN/OUT: Incr. by number tokens inserted */
){
  int rc;
  int iStart = 0;
  int iEnd = 0;
  int iPos = 0;
  int nWord = 0;

  char const *zToken;
  int nToken = 0;

  sqlite3_tokenizer *pTokenizer = p->pTokenizer;
  sqlite3_tokenizer_module const *pModule = pTokenizer->pModule;
  sqlite3_tokenizer_cursor *pCsr;
  int (*xNext)(sqlite3_tokenizer_cursor *pCursor,
      const char**,int*,int*,int*,int*);

  assert( pTokenizer && pModule );

  /* If the user has inserted a NULL value, this function may be called with
  ** zText==0. In this case, add zero token entries to the hash table and 
  ** return early. */
  if( zText==0 ){
    *pnWord = 0;
    return SQLITE_OK;
  }

  rc = sqlite3Fts3OpenTokenizer(pTokenizer, iLangid, zText, -1, &pCsr);
  if( rc!=SQLITE_OK ){
    return rc;
  }

  xNext = pModule->xNext;
  while( SQLITE_OK==rc
      && SQLITE_OK==(rc = xNext(pCsr, &zToken, &nToken, &iStart, &iEnd, &iPos))
  ){
    int i;
    if( iPos>=nWord ) nWord = iPos+1;

    /* Positions cannot be negative; we use -1 as a terminator internally.
    ** Tokens must have a non-zero length.
    */
    if( iPos<0 || !zToken || nToken<=0 ){
      rc = SQLITE_ERROR;
      break;
    }

    /* Add the term to the terms index */
    rc = fts3PendingTermsAddOne(
        p, iCol, iPos, &p->aIndex[0].hPending, zToken, nToken
    );
    
    /* Add the term to each of the prefix indexes that it is not too 
    ** short for. */
    for(i=1; rc==SQLITE_OK && i<p->nIndex; i++){
      struct Fts3Index *pIndex = &p->aIndex[i];
      if( nToken<pIndex->nPrefix ) continue;
      rc = fts3PendingTermsAddOne(
          p, iCol, iPos, &pIndex->hPending, zToken, pIndex->nPrefix
      );
    }
  }

  pModule->xClose(pCsr);
  *pnWord += nWord;
  return (rc==SQLITE_DONE ? SQLITE_OK : rc);
}